

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.h
# Opt level: O1

ChCoordsys<double> * __thiscall chrono::ChLinkMarkers::GetLinkRelativeCoords(ChLinkMarkers *this)

{
  ChMarker *pCVar1;
  ChCoordsys<double> *in_RDI;
  
  pCVar1 = this->marker2;
  (in_RDI->pos).m_data[0] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  (in_RDI->pos).m_data[1] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  (in_RDI->pos).m_data[2] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  (in_RDI->rot).m_data[0] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  (in_RDI->rot).m_data[1] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  (in_RDI->rot).m_data[2] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  (in_RDI->rot).m_data[3] =
       (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  return in_RDI;
}

Assistant:

virtual ChCoordsys<> GetLinkRelativeCoords() override { return marker2->GetCoord(); }